

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O2

void __thiscall Fl_Graphics_Driver::rect(Fl_Graphics_Driver *this,int x,int y,int w,int h)

{
  int iVar1;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  if (0 < h && 0 < w) {
    local_10 = h;
    local_c = w;
    local_8 = y;
    local_4 = x;
    iVar1 = clip_to_short(&local_4,&local_8,&local_c,&local_10);
    if (iVar1 == 0) {
      XDrawRectangle(fl_display,fl_window,fl_gc,local_4,local_8,local_c + -1,local_10 + -1);
    }
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::rect(int x, int y, int w, int h) {

  if (w<=0 || h<=0) return;
#if defined(USE_X11)
  if (!clip_to_short(x, y, w, h))
    XDrawRectangle(fl_display, fl_window, fl_gc, x, y, w-1, h-1);
#elif defined(WIN32)
  MoveToEx(fl_gc, x, y, 0L); 
  LineTo(fl_gc, x+w-1, y);
  LineTo(fl_gc, x+w-1, y+h-1);
  LineTo(fl_gc, x, y+h-1);
  LineTo(fl_gc, x, y);
#elif defined(__APPLE_QUARTZ__)
  if ( (!USINGQUARTZPRINTER) && fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, true);
  CGRect rect = CGRectMake(x, y, w-1, h-1);
  CGContextStrokeRect(fl_gc, rect);
  if ( (!USINGQUARTZPRINTER) && fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}